

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O2

Promise<kj::Maybe<capnp::MessageReaderAndFds>_> __thiscall
capnp::AsyncIoMessageStream::tryReadMessage
          (AsyncIoMessageStream *this,ArrayPtr<kj::OwnFd> fdSpace,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  _func_int *p_Var1;
  void *pvVar2;
  ulong in_R9;
  TransformPromiseNodeBase *this_00;
  ReaderOptions options_00;
  ArrayPtr<capnp::word> scratchSpace_00;
  AsyncInputStream local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  scratchSpace_00.ptr = (word *)(in_R9 & 0xffffffff);
  options_00._8_8_ = options._8_8_;
  options_00.traversalLimitInWords = *(uint64_t *)(fdSpace.ptr + 2);
  scratchSpace_00.size_ = (size_t)scratchSpace.ptr;
  capnp::tryReadMessage(&local_38,options_00,scratchSpace_00);
  p_Var1 = local_38._vptr_AsyncInputStream[1];
  if (p_Var1 == (_func_int *)0x0 ||
      (ulong)((long)local_38._vptr_AsyncInputStream - (long)p_Var1) < 0x28) {
    pvVar2 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar2 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_38,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:439:11)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar2 + 0x3d8) = &PTR_destroy_00661a08;
    *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
  }
  else {
    local_38._vptr_AsyncInputStream[1] = (_func_int *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_38._vptr_AsyncInputStream + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_38,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::Own<capnp::MessageReader,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:439:11)>
               ::anon_class_1_0_00000001_for_func::operator());
    local_38._vptr_AsyncInputStream[-5] = (_func_int *)&PTR_destroy_00661a08;
    local_38._vptr_AsyncInputStream[-4] = p_Var1;
  }
  local_30.ptr = (PromiseNode *)0x0;
  (this->super_MessageStream)._vptr_MessageStream = (_func_int **)this_00;
  local_28.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_30);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_38);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<MessageReaderAndFds>> AsyncIoMessageStream::tryReadMessage(
    kj::ArrayPtr<kj::OwnFd> fdSpace,
    ReaderOptions options,
    kj::ArrayPtr<word> scratchSpace) {
  return capnp::tryReadMessage(stream, options, scratchSpace)
    .then([](kj::Maybe<kj::Own<MessageReader>> maybeReader) -> kj::Maybe<MessageReaderAndFds> {
      KJ_IF_SOME(reader, maybeReader) {
        return MessageReaderAndFds { kj::mv(reader), nullptr };
      } else {
        return kj::none;
      }
    });
}